

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__process_frame_header(stbi__jpeg *z,int scan)

{
  stbi_uc *psVar1;
  stbi_uc *psVar2;
  uint uVar3;
  stbi__context *s;
  byte *pbVar4;
  stbi_uc sVar5;
  uint uVar6;
  stbi__uint32 sVar7;
  int iVar8;
  uint uVar9;
  stbi_uc *psVar10;
  void *pvVar11;
  stbi_uc *psVar12;
  long lVar13;
  short *psVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  stbi_uc **ppsVar19;
  long lVar20;
  uint uVar21;
  int iVar22;
  int iVar23;
  int *piVar24;
  bool bVar25;
  
  s = z->s;
  uVar6 = stbi__get16be(s);
  if (uVar6 < 0xb) {
    stbi__g_failure_reason = "bad SOF len";
    return 0;
  }
  psVar10 = s->img_buffer;
  if (psVar10 < s->img_buffer_end) {
    s->img_buffer = psVar10 + 1;
    sVar5 = *psVar10;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00166b1e;
    psVar10 = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar10,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar12 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      sVar5 = '\0';
    }
    else {
      psVar12 = psVar10 + iVar8;
      sVar5 = *psVar10;
    }
    s->img_buffer_end = psVar12;
    s->img_buffer = s->buffer_start + 1;
  }
  if (sVar5 != '\b') {
LAB_00166b1e:
    stbi__g_failure_reason = "only 8-bit";
    return 0;
  }
  sVar7 = stbi__get16be(s);
  s->img_y = sVar7;
  if (sVar7 == 0) {
    stbi__g_failure_reason = "no header height";
    return 0;
  }
  sVar7 = stbi__get16be(s);
  s->img_x = sVar7;
  if (sVar7 == 0) {
    stbi__g_failure_reason = "0 width";
    return 0;
  }
  pbVar4 = s->img_buffer;
  psVar10 = s->img_buffer_end;
  if (pbVar4 < psVar10) {
    psVar12 = pbVar4 + 1;
    s->img_buffer = psVar12;
    bVar15 = *pbVar4;
  }
  else {
    if (s->read_from_callbacks == 0) goto LAB_00166e04;
    psVar12 = s->buffer_start;
    iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar12,s->buflen);
    if (iVar8 == 0) {
      s->read_from_callbacks = 0;
      psVar10 = s->buffer_start + 1;
      s->buffer_start[0] = '\0';
      bVar15 = 0;
    }
    else {
      psVar10 = psVar12 + iVar8;
      bVar15 = *psVar12;
    }
    s->img_buffer_end = psVar10;
    psVar12 = s->buffer_start + 1;
    s->img_buffer = psVar12;
  }
  if ((bVar15 & 0xfd) == 1) {
    uVar16 = (uint)bVar15;
    s->img_n = uVar16;
    uVar18 = (ulong)uVar16;
    ppsVar19 = &z->img_comp[0].linebuf;
    do {
      ppsVar19[-3] = (stbi_uc *)0x0;
      *ppsVar19 = (stbi_uc *)0x0;
      ppsVar19 = ppsVar19 + 0xc;
      uVar18 = uVar18 - 1;
    } while (uVar18 != 0);
    if (uVar6 != uVar16 * 3 + 8) {
      stbi__g_failure_reason = "bad SOF len";
      return 0;
    }
    z->rgb = 0;
    psVar1 = s->buffer_start;
    psVar2 = s->buffer_start + 1;
    piVar24 = &z->img_comp[0].tq;
    uVar18 = 0;
    while( true ) {
      uVar6 = s->img_n;
      lVar20 = (long)(int)uVar6;
      if (lVar20 <= (long)uVar18) {
        if (scan != 0) {
          return 1;
        }
        uVar16 = s->img_x;
        uVar3 = s->img_y;
        if ((uint)((0x40000000 / (ulong)uVar16) / (ulong)uVar6) < uVar3) {
          stbi__g_failure_reason = "too large";
          return 0;
        }
        uVar17 = 1;
        uVar18 = 1;
        if (0 < (int)uVar6) {
          uVar18 = 1;
          lVar13 = 0;
          uVar17 = 1;
          do {
            uVar9 = *(uint *)((long)&z->img_comp[0].h + lVar13);
            uVar21 = *(uint *)((long)&z->img_comp[0].v + lVar13);
            if ((int)uVar17 < (int)uVar9) {
              uVar17 = uVar9;
            }
            if ((int)uVar18 < (int)uVar21) {
              uVar18 = (ulong)uVar21;
            }
            lVar13 = lVar13 + 0x60;
          } while (lVar20 * 0x60 != lVar13);
        }
        iVar8 = (int)uVar18;
        uVar21 = ((uVar16 + uVar17 * 8) - 1) / (uVar17 * 8);
        uVar9 = ((uVar3 + iVar8 * 8) - 1) / (uint)(iVar8 * 8);
        z->img_h_max = uVar17;
        z->img_v_max = iVar8;
        z->img_mcu_w = uVar17 * 8;
        z->img_mcu_h = iVar8 * 8;
        z->img_mcu_x = uVar21;
        z->img_mcu_y = uVar9;
        if (0 < (int)uVar6) {
          piVar24 = &z->img_comp[0].coeff_h;
          lVar13 = 1;
          do {
            piVar24[-0x10] = (piVar24[-0x16] * uVar16 + (uVar17 - 1)) / uVar17;
            piVar24[-0xf] = (int)((piVar24[-0x15] * uVar3 + iVar8 + -1) / uVar18);
            iVar22 = piVar24[-0x16] * uVar21;
            piVar24[-0xe] = iVar22 * 8;
            iVar23 = piVar24[-0x15] * uVar9;
            piVar24[-0xd] = iVar23 * 8;
            pvVar11 = malloc((long)(int)(iVar23 * 8 * iVar22 * 8 | 0xf));
            *(void **)(piVar24 + -9) = pvVar11;
            if (pvVar11 == (void *)0x0) {
              if (lVar13 == 1) {
                stbi__g_failure_reason = "outofmem";
                return 0;
              }
              do {
                uVar6 = (int)lVar13 - 2;
                free(z->img_comp[uVar6].raw_data);
                z->img_comp[uVar6].raw_data = (void *)0x0;
                lVar13 = lVar13 + -1;
              } while (1 < lVar13);
              stbi__g_failure_reason = "outofmem";
              return 0;
            }
            *(stbi_uc **)(piVar24 + -0xb) = (stbi_uc *)((long)pvVar11 + 0xfU & 0xfffffffffffffff0);
            *(stbi_uc **)(piVar24 + -5) = (stbi_uc *)0x0;
            if (z->progressive == 0) {
              psVar14 = (short *)0x0;
              pvVar11 = (void *)0x0;
            }
            else {
              piVar24[-1] = iVar22;
              *piVar24 = iVar23;
              pvVar11 = malloc((long)(iVar22 * iVar23 * 0x40) * 2 + 0xf);
              psVar14 = (short *)((long)pvVar11 + 0xfU & 0xfffffffffffffff0);
            }
            *(short **)(piVar24 + -3) = psVar14;
            *(void **)(piVar24 + -7) = pvVar11;
            piVar24 = piVar24 + 0x18;
            bVar25 = lVar13 != lVar20;
            lVar13 = lVar13 + 1;
          } while (bVar25);
          return 1;
        }
        return 1;
      }
      if (psVar12 < psVar10) {
        s->img_buffer = psVar12 + 1;
        bVar15 = *psVar12;
        psVar12 = psVar12 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar15 = 0;
      }
      else {
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar15 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar15 = *psVar1;
          psVar10 = psVar1 + iVar8;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar12 = psVar2;
      }
      ((anon_struct_96_18_0d0905d3 *)(piVar24 + -3))->id = (uint)bVar15;
      if (uVar18 != bVar15 && uVar18 + 1 != (ulong)bVar15) {
        if (bVar15 != "RGB"[uVar18]) {
          stbi__g_failure_reason = "bad component ID";
          return 0;
        }
        z->rgb = z->rgb + 1;
      }
      if (psVar12 < psVar10) {
        s->img_buffer = psVar12 + 1;
        bVar15 = *psVar12;
        psVar12 = psVar12 + 1;
      }
      else {
        if (s->read_from_callbacks == 0) {
          piVar24[-2] = 0;
          stbi__g_failure_reason = "bad H";
          return 0;
        }
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar15 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar15 = *psVar1;
          psVar10 = psVar1 + iVar8;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar12 = psVar2;
      }
      piVar24[-2] = (uint)(bVar15 >> 4);
      if ((byte)(bVar15 + 0xb0) < 0xc0) break;
      piVar24[-1] = bVar15 & 0xf;
      if ((bVar15 & 0xf) - 5 < 0xfffffffc) {
        stbi__g_failure_reason = "bad V";
        return 0;
      }
      if (psVar12 < psVar10) {
        s->img_buffer = psVar12 + 1;
        bVar15 = *psVar12;
        psVar12 = psVar12 + 1;
      }
      else if (s->read_from_callbacks == 0) {
        bVar15 = 0;
      }
      else {
        iVar8 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar8 == 0) {
          s->read_from_callbacks = 0;
          s->buffer_start[0] = '\0';
          bVar15 = 0;
          psVar10 = psVar2;
        }
        else {
          bVar15 = *psVar1;
          psVar10 = psVar1 + iVar8;
        }
        s->img_buffer_end = psVar10;
        s->img_buffer = psVar2;
        psVar12 = psVar2;
      }
      *piVar24 = (uint)bVar15;
      piVar24 = piVar24 + 0x18;
      uVar18 = uVar18 + 1;
      if (3 < bVar15) {
        stbi__g_failure_reason = "bad TQ";
        return 0;
      }
    }
    stbi__g_failure_reason = "bad H";
    return 0;
  }
LAB_00166e04:
  stbi__g_failure_reason = "bad component count";
  return 0;
}

Assistant:

static int stbi__process_frame_header(stbi__jpeg *z, int scan)
{
   stbi__context *s = z->s;
   int Lf,p,i,q, h_max=1,v_max=1,c;
   Lf = stbi__get16be(s);         if (Lf < 11) return stbi__err("bad SOF len","Corrupt JPEG"); // JPEG
   p  = stbi__get8(s);            if (p != 8) return stbi__err("only 8-bit","JPEG format not supported: 8-bit only"); // JPEG baseline
   s->img_y = stbi__get16be(s);   if (s->img_y == 0) return stbi__err("no header height", "JPEG format not supported: delayed height"); // Legal, but we don't handle it--but neither does IJG
   s->img_x = stbi__get16be(s);   if (s->img_x == 0) return stbi__err("0 width","Corrupt JPEG"); // JPEG requires
   c = stbi__get8(s);
   if (c != 3 && c != 1) return stbi__err("bad component count","Corrupt JPEG");    // JFIF requires
   s->img_n = c;
   for (i=0; i < c; ++i) {
      z->img_comp[i].data = NULL;
      z->img_comp[i].linebuf = NULL;
   }

   if (Lf != 8+3*s->img_n) return stbi__err("bad SOF len","Corrupt JPEG");

   z->rgb = 0;
   for (i=0; i < s->img_n; ++i) {
      static unsigned char rgb[3] = { 'R', 'G', 'B' };
      z->img_comp[i].id = stbi__get8(s);
      if (z->img_comp[i].id != i+1)   // JFIF requires
         if (z->img_comp[i].id != i) {  // some version of jpegtran outputs non-JFIF-compliant files!
            // somethings output this (see http://fileformats.archiveteam.org/wiki/JPEG#Color_format)
            if (z->img_comp[i].id != rgb[i])
               return stbi__err("bad component ID","Corrupt JPEG");
            ++z->rgb;
         }
      q = stbi__get8(s);
      z->img_comp[i].h = (q >> 4);  if (!z->img_comp[i].h || z->img_comp[i].h > 4) return stbi__err("bad H","Corrupt JPEG");
      z->img_comp[i].v = q & 15;    if (!z->img_comp[i].v || z->img_comp[i].v > 4) return stbi__err("bad V","Corrupt JPEG");
      z->img_comp[i].tq = stbi__get8(s);  if (z->img_comp[i].tq > 3) return stbi__err("bad TQ","Corrupt JPEG");
   }

   if (scan != STBI__SCAN_load) return 1;

   if ((1 << 30) / s->img_x / s->img_n < s->img_y) return stbi__err("too large", "Image too large to decode");

   for (i=0; i < s->img_n; ++i) {
      if (z->img_comp[i].h > h_max) h_max = z->img_comp[i].h;
      if (z->img_comp[i].v > v_max) v_max = z->img_comp[i].v;
   }

   // compute interleaved mcu info
   z->img_h_max = h_max;
   z->img_v_max = v_max;
   z->img_mcu_w = h_max * 8;
   z->img_mcu_h = v_max * 8;
   z->img_mcu_x = (s->img_x + z->img_mcu_w-1) / z->img_mcu_w;
   z->img_mcu_y = (s->img_y + z->img_mcu_h-1) / z->img_mcu_h;

   for (i=0; i < s->img_n; ++i) {
      // number of effective pixels (e.g. for non-interleaved MCU)
      z->img_comp[i].x = (s->img_x * z->img_comp[i].h + h_max-1) / h_max;
      z->img_comp[i].y = (s->img_y * z->img_comp[i].v + v_max-1) / v_max;
      // to simplify generation, we'll allocate enough memory to decode
      // the bogus oversized data from using interleaved MCUs and their
      // big blocks (e.g. a 16x16 iMCU on an image of width 33); we won't
      // discard the extra data until colorspace conversion
      z->img_comp[i].w2 = z->img_mcu_x * z->img_comp[i].h * 8;
      z->img_comp[i].h2 = z->img_mcu_y * z->img_comp[i].v * 8;
      z->img_comp[i].raw_data = stbi__malloc(z->img_comp[i].w2 * z->img_comp[i].h2+15);

      if (z->img_comp[i].raw_data == NULL) {
         for(--i; i >= 0; --i) {
            STBI_FREE(z->img_comp[i].raw_data);
            z->img_comp[i].raw_data = NULL;
         }
         return stbi__err("outofmem", "Out of memory");
      }
      // align blocks for idct using mmx/sse
      z->img_comp[i].data = (stbi_uc*) (((size_t) z->img_comp[i].raw_data + 15) & ~15);
      z->img_comp[i].linebuf = NULL;
      if (z->progressive) {
         z->img_comp[i].coeff_w = (z->img_comp[i].w2 + 7) >> 3;
         z->img_comp[i].coeff_h = (z->img_comp[i].h2 + 7) >> 3;
         z->img_comp[i].raw_coeff = STBI_MALLOC(z->img_comp[i].coeff_w * z->img_comp[i].coeff_h * 64 * sizeof(short) + 15);
         z->img_comp[i].coeff = (short*) (((size_t) z->img_comp[i].raw_coeff + 15) & ~15);
      } else {
         z->img_comp[i].coeff = 0;
         z->img_comp[i].raw_coeff = 0;
      }
   }

   return 1;
}